

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_test(stbi__context *s)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  bool bVar8;
  
  pbVar1 = s->img_buffer;
  pbVar2 = s->img_buffer_end;
  if (pbVar1 < pbVar2) {
LAB_00112a72:
    pbVar1 = pbVar1 + 1;
    s->img_buffer = pbVar1;
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    pbVar1 = s->img_buffer;
    pbVar2 = s->img_buffer_end;
    goto LAB_00112a72;
  }
  if (pbVar1 < pbVar2) {
LAB_00112a96:
    s->img_buffer = pbVar1 + 1;
    if (*pbVar1 < 2) {
      pbVar2 = s->img_buffer_end;
      bVar8 = *pbVar1 == 0;
      pbVar1 = pbVar1 + 1;
      goto LAB_00112abc;
    }
LAB_00112b25:
    uVar6 = 0;
    goto LAB_00112c8a;
  }
  if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    pbVar1 = s->img_buffer;
    goto LAB_00112a96;
  }
  bVar8 = true;
LAB_00112abc:
  if (pbVar1 < pbVar2) {
LAB_00112ada:
    s->img_buffer = pbVar1 + 1;
    bVar4 = *pbVar1;
    pbVar1 = pbVar1 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar1 = s->img_buffer;
      goto LAB_00112ada;
    }
    bVar4 = 0;
  }
  if (bVar8) {
    if ((bVar4 & 0xf6) != 2) goto LAB_00112b25;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00112b76:
      pbVar1 = pbVar1 + 9;
      goto LAB_00112c0a;
    }
    iVar5 = (int)s->img_buffer_end - (int)pbVar1;
    if (8 < iVar5) goto LAB_00112b76;
    s->img_buffer = s->img_buffer_end;
    pvVar7 = s->io_user_data;
    iVar5 = 9 - iVar5;
LAB_00112c01:
    (*(s->io).skip)(pvVar7,iVar5);
  }
  else {
    uVar6 = 0;
    if ((bVar4 & 0xf7) != 1) goto LAB_00112c8a;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00112b7f:
      pbVar1 = pbVar1 + 4;
      s->img_buffer = pbVar1;
    }
    else {
      iVar5 = (int)s->img_buffer_end - (int)pbVar1;
      if (3 < iVar5) goto LAB_00112b7f;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar5);
      pbVar1 = s->img_buffer;
    }
    if (s->img_buffer_end <= pbVar1) {
      if (s->read_from_callbacks == 0) goto LAB_00112c8a;
      stbi__refill_buffer(s);
      pbVar1 = s->img_buffer;
    }
    s->img_buffer = pbVar1 + 1;
    if ((0x20 < (ulong)*pbVar1) || ((0x101018100U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0))
    goto LAB_00112c8a;
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar5 = (int)s->img_buffer_end - (int)(pbVar1 + 1);
      if (iVar5 < 4) {
        s->img_buffer = s->img_buffer_end;
        pvVar7 = s->io_user_data;
        iVar5 = 4 - iVar5;
        goto LAB_00112c01;
      }
    }
    pbVar1 = pbVar1 + 5;
LAB_00112c0a:
    s->img_buffer = pbVar1;
  }
  iVar5 = stbi__get16le(s);
  uVar6 = 0;
  if (iVar5 == 0) goto LAB_00112c8a;
  iVar5 = stbi__get16le(s);
  if (iVar5 == 0) goto LAB_00112c8a;
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
LAB_00112c50:
    s->img_buffer = pbVar2 + 1;
    uVar3 = (ulong)*pbVar2;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
      goto LAB_00112c50;
    }
    uVar3 = 0;
  }
  if (bVar8) {
    if (((byte)uVar3 < 0x21) && (uVar6 = 0, (0x101018100U >> (uVar3 & 0x3f) & 1) != 0)) {
      uVar6 = 1;
    }
  }
  else {
    uVar6 = (uint)(((byte)uVar3 - 8 & 0xf7) == 0);
  }
LAB_00112c8a:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar6;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}